

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>_>_>::dispose
          (Own<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>_>_> *this)

{
  AttachmentPromiseNode<kj::Own<kj::WebSocket>_> *object;
  AttachmentPromiseNode<kj::Own<kj::WebSocket>_> *ptrCopy;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>_>_> *this_local;
  
  object = this->ptr;
  if (object != (AttachmentPromiseNode<kj::Own<kj::WebSocket>_> *)0x0) {
    this->ptr = (AttachmentPromiseNode<kj::Own<kj::WebSocket>_> *)0x0;
    Disposer::dispose<kj::_::AttachmentPromiseNode<kj::Own<kj::WebSocket>>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }